

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::detail::ResultOfMatcher<int(int),iutest::detail::LeMatcher<int>>::operator()
          (AssertionResult *__return_storage_ptr__,
          ResultOfMatcher<int(int),iutest::detail::LeMatcher<int>> *this,int *actual)

{
  bool bVar1;
  AssertionResult *rhs;
  string sStack_58;
  AssertionResult local_38;
  
  bVar1 = ResultOfMatcher<int_(int),_iutest::detail::LeMatcher<int>_>::Check<int>
                    ((ResultOfMatcher<int_(int),_iutest::detail::LeMatcher<int>_> *)this,actual);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_38.m_message._M_dataplus._M_p = (pointer)&local_38.m_message.field_2;
    local_38.m_message._M_string_length = 0;
    local_38.m_message.field_2._M_local_buf[0] = '\0';
    local_38.m_result = false;
    WhichIs_abi_cxx11_(&sStack_58,this);
    rhs = AssertionResult::operator<<(&local_38,&sStack_58);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }